

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)

{
  bool bVar1;
  SQInteger SVar2;
  SQObjectPtr *local_30;
  SQObjectPtr *arr;
  SQInteger newsize_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  arr = (SQObjectPtr *)newsize;
  newsize_local = idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 1) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,newsize_local,OT_ARRAY,&local_30);
    if (bVar1) {
      if ((long)arr < 0) {
        v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"negative size");
      }
      else {
        SQArray::Resize((local_30->super_SQObject)._unVal.pArray,(SQInteger)arr);
        v_local = (HSQUIRRELVM)0x0;
      }
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)
{
    sq_aux_paramscheck(v,1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(newsize >= 0) {
        _array(*arr)->Resize(newsize);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("negative size"));
}